

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameWalkWith(Walker *pWalker,Select *pSelect)

{
  Select *p;
  With *pWVar1;
  long lVar2;
  long lVar3;
  NameContext sNC;
  NameContext local_68;
  
  if (pSelect->pWith != (With *)0x0) {
    pWVar1 = pSelect->pWith;
    if (0 < pWVar1->nCte) {
      lVar3 = 0x20;
      lVar2 = 0;
      do {
        p = *(Select **)((long)pWVar1->a + lVar3 + -0x10);
        local_68.nRef = 0;
        local_68.nErr = 0;
        local_68.ncFlags = 0;
        local_68._42_6_ = 0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.pSrcList = (SrcList *)0x0;
        local_68.pWinSelect = (Select *)0x0;
        local_68.pParse = pWalker->pParse;
        sqlite3SelectPrep(local_68.pParse,p,&local_68);
        sqlite3WalkSelect(pWalker,p);
        lVar2 = lVar2 + 1;
        pWVar1 = pSelect->pWith;
        lVar3 = lVar3 + 0x20;
      } while (lVar2 < pWVar1->nCte);
    }
  }
  return;
}

Assistant:

static void renameWalkWith(Walker *pWalker, Select *pSelect){
  if( pSelect->pWith ){
    int i;
    for(i=0; i<pSelect->pWith->nCte; i++){
      Select *p = pSelect->pWith->a[i].pSelect;
      NameContext sNC;
      memset(&sNC, 0, sizeof(sNC));
      sNC.pParse = pWalker->pParse;
      sqlite3SelectPrep(sNC.pParse, p, &sNC);
      sqlite3WalkSelect(pWalker, p);
    }
  }
}